

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tree.cpp
# Opt level: O2

void initSearchTree(int *array,int length,Tree<int> *tree)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined8 *puVar5;
  undefined4 extraout_var;
  int *piVar6;
  long *plVar7;
  long lVar8;
  long *plVar9;
  bool local_49;
  
  if (length == 0) {
    (*tree->_vptr_Tree[9])(tree,0);
    return;
  }
  puVar5 = (undefined8 *)operator_new(0x30);
  *puVar5 = &PTR_getLeftPoint_00106d58;
  puVar5[1] = 0;
  *(undefined4 *)(puVar5 + 2) = 0;
  puVar5[3] = array;
  *(undefined4 *)(puVar5 + 4) = 0;
  puVar5[5] = 0;
  (*tree->_vptr_Tree[9])(tree,puVar5);
  local_49 = true;
  lVar8 = 1;
  plVar9 = (long *)0x0;
  do {
    if (length <= lVar8) {
      return;
    }
    iVar4 = (*tree->_vptr_Tree[8])(tree);
    piVar1 = array + lVar8;
    plVar7 = (long *)CONCAT44(extraout_var,iVar4);
LAB_0010238a:
    if (plVar7 != (long *)0x0) {
      iVar2 = *piVar1;
      piVar6 = (int *)(**(code **)(*plVar7 + 0x20))(plVar7);
      iVar4 = *piVar6;
      plVar9 = plVar7;
      if (iVar4 < iVar2) break;
      puVar5 = (undefined8 *)*plVar7;
      goto LAB_001023c7;
    }
    puVar5 = (undefined8 *)operator_new(0x30);
    *puVar5 = &PTR_getLeftPoint_00106d58;
    puVar5[1] = 0;
    *(undefined4 *)(puVar5 + 2) = 0;
    puVar5[3] = piVar1;
    *(undefined4 *)(puVar5 + 4) = 0;
    puVar5[5] = 0;
    (**(code **)(*plVar9 + 8 + (ulong)(((byte)~local_49 & 1) << 6)))(plVar9,puVar5);
    lVar8 = lVar8 + 1;
  } while( true );
  iVar3 = *piVar1;
  piVar6 = (int *)(**(code **)(*plVar7 + 0x20))(plVar7);
  if (*piVar6 < iVar3) {
    puVar5 = (undefined8 *)(*plVar7 + 0x40);
LAB_001023c7:
    plVar7 = (long *)(*(code *)*puVar5)(plVar7);
    local_49 = iVar2 <= iVar4;
  }
  goto LAB_0010238a;
}

Assistant:

void initSearchTree(int* array, int length, Tree<int>& tree){
    if (length == 0){
        tree.setRoot(nullptr);
        return;
    }
    Node<int>* node = new Node<int>(array[0]);
    Node<int>* parent = nullptr;
    bool isLeft = true;
    tree.setRoot(node);
    for (int i = 1; i < length; ++i) {
        node = tree.getRoot();
        while (node){
            parent = node;
            if (array[i] <= node->getDataNode()){
                node = node->getLeftPoint();
                isLeft = true;
            } else if (array[i] > node->getDataNode()){
                    node = node->getRightPoint();
                    isLeft = false;
            }
        }
        node = new Node<int>(array[i]);
        if (isLeft){
            parent->setLeftPoint(node);
        } else {
            parent->setRightPoint(node);
        }
    }
}